

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O2

void testScanLineApi(string *tempDir)

{
  float *pfVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int ySize;
  int iVar5;
  ostream *poVar6;
  uint *puVar7;
  half *phVar8;
  long lVar9;
  long lVar10;
  int rmode;
  int H;
  long lVar11;
  half *this;
  int lorder;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int in_stack_ffffffffffffff48;
  Array2D<float> pf;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing the scanline API for tiled files");
  std::endl<char,std::char_traits<char>>(poVar6);
  pi._sizeX = 0x51;
  pi._sizeY = 0x30;
  puVar7 = (uint *)operator_new__(0x3cc0);
  ph._sizeX = 0x51;
  ph._sizeY = 0x30;
  pi._data = puVar7;
  phVar8 = (half *)operator_new__(0x1e60);
  pf._sizeX = 0x51;
  pf._sizeY = 0x30;
  ph._data = phVar8;
  pf._data = (float *)operator_new__(0x3cc0);
  iVar4 = 0;
  lVar9 = 0;
  for (lVar10 = 0; pfVar1 = pf._data, lVar10 != 0x51; lVar10 = lVar10 + 1) {
    lVar11 = pf._sizeY * lVar9;
    this = phVar8;
    for (lVar12 = 0; lVar12 != 0x30; lVar12 = lVar12 + 1) {
      puVar7[lVar12] = (int)lVar12 + iVar4;
      dVar13 = (double)(int)lVar12;
      dVar14 = sin(dVar13);
      dVar15 = sin((double)(int)lVar10 * 0.5);
      Imath_3_2::half::operator=(this,(float)(dVar15 + dVar14));
      dVar14 = sin((double)(int)lVar10);
      dVar13 = sin(dVar13 * 0.5);
      *(float *)((long)pfVar1 + lVar12 * 4 + lVar11) = (float)(dVar13 + dVar14);
      this = this + 1;
    }
    lVar9 = lVar9 + 4;
    phVar8 = phVar8 + 0x30;
    puVar7 = puVar7 + 0x30;
    iVar4 = iVar4 + 100;
  }
  bVar2 = IlmThread_3_2::supportsThreads();
  iVar4 = (uint)bVar2 + (uint)bVar2 * 2 + 1;
  for (ySize = 0; ySize != iVar4; ySize = ySize + 1) {
    cVar3 = IlmThread_3_2::supportsThreads();
    if (cVar3 != '\0') {
      Imf_3_2::setGlobalThreadCount(ySize);
      poVar6 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar5 = Imf_3_2::globalThreadCount();
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
      for (H = 0; H != 2; H = H + 1) {
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,ROUND_UP,1,
                   in_stack_ffffffffffffff48,iVar4,ySize);
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,ROUND_UP,1,
                   in_stack_ffffffffffffff48,iVar4,ySize);
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,0x18,0x1a,
                   in_stack_ffffffffffffff48,iVar4,ySize);
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,0x18,0x1a,
                   in_stack_ffffffffffffff48,iVar4,ySize);
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,0x30,0x51,
                   in_stack_ffffffffffffff48,iVar4,ySize);
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,0x30,0x51,
                   in_stack_ffffffffffffff48,iVar4,ySize);
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,0x80,0x60,
                   in_stack_ffffffffffffff48,iVar4,ySize);
        anon_unknown.dwarf_26957e::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,0x80,0x60,
                   in_stack_ffffffffffffff48,iVar4,ySize);
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar6);
  Imf_3_2::Array2D<float>::~Array2D(&pf);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&ph);
  Imf_3_2::Array2D<unsigned_int>::~Array2D(&pi);
  return;
}

Assistant:

void
testScanLineApi (const std::string& tempDir)
{
    try
    {
        cout << "Testing the scanline API for tiled files" << endl;

        const int W  = 48;
        const int H  = 81;
        const int DX = -17;
        const int DY = -29;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);
        fillPixels (pi, ph, pf, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int lorder = 0; lorder < NUM_LINEORDERS; ++lorder)
            {
                for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
                {
                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        128,
                        96);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        128,
                        96);
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}